

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall
re2::SimplifyWalker::ShortVisit(SimplifyWalker *this,Regexp *re,Regexp *parent_arg)

{
  ostream *poVar1;
  Regexp *pRVar2;
  LogMessage local_1a0;
  Regexp *local_20;
  Regexp *parent_arg_local;
  Regexp *re_local;
  SimplifyWalker *this_local;
  
  local_20 = parent_arg;
  parent_arg_local = re;
  re_local = (Regexp *)this;
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
             0x1b4);
  poVar1 = LogMessage::stream(&local_1a0);
  std::operator<<(poVar1,"SimplifyWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  pRVar2 = Regexp::Incref(parent_arg_local);
  return pRVar2;
}

Assistant:

Regexp* SimplifyWalker::ShortVisit(Regexp* re, Regexp* parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "SimplifyWalker::ShortVisit called";
  return re->Incref();
}